

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkAlgConDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)con_index;
  if ((ulong)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= uVar3) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->is_alg_con_deleted_,
               (long)((int)((ulong)((long)(this->algebraic_cons_).
                                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->algebraic_cons_).
                                         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0xf0f0f0f),false);
  }
  uVar2 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar2 = uVar3;
  }
  puVar1 = (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar2 >> 6) +
           (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)con_index & 0x3f);
  return;
}

Assistant:

void MarkAlgConDeleted(int con_index) {
    internal::CheckIndex(con_index, algebraic_cons_.size());
    if (is_alg_con_deleted_.size() <= static_cast<std::size_t>(con_index))
      is_alg_con_deleted_.resize(num_algebraic_cons());
    is_alg_con_deleted_[con_index] = true;
  }